

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNullDriver.cpp
# Opt level: O0

s32 __thiscall
irr::video::CNullDriver::addHighLevelShaderMaterialFromFiles
          (CNullDriver *this,IReadFile *vertexShaderProgram,c8 *vertexShaderEntryPointName,
          E_VERTEX_SHADER_TYPE vsCompileTarget,IReadFile *pixelShaderProgram,
          c8 *pixelShaderEntryPointName,E_PIXEL_SHADER_TYPE psCompileTarget,
          IReadFile *geometryShaderProgram,c8 *geometryShaderEntryPointName,
          E_GEOMETRY_SHADER_TYPE gsCompileTarget,E_PRIMITIVE_TYPE inType,E_PRIMITIVE_TYPE outType,
          u32 verticesOut,IShaderConstantSetCallBack *callback,E_MATERIAL_TYPE baseMaterial,
          s32 userData)

{
  s32 sVar1;
  long lVar2;
  undefined4 in_ECX;
  undefined8 in_RDX;
  long *in_RSI;
  long *in_RDI;
  long *in_R8;
  undefined8 in_R9;
  undefined4 in_stack_00000008;
  long *in_stack_00000010;
  undefined8 in_stack_00000018;
  undefined4 in_stack_00000020;
  undefined4 in_stack_00000028;
  undefined4 in_stack_00000030;
  undefined4 in_stack_00000038;
  undefined8 in_stack_00000040;
  undefined4 in_stack_00000048;
  undefined4 in_stack_00000050;
  s32 result;
  long size_2;
  long size_1;
  long size;
  c8 *gs;
  c8 *ps;
  c8 *vs;
  void *local_78;
  void *local_70;
  void *local_68;
  
  local_68 = (void *)0x0;
  local_70 = (void *)0x0;
  local_78 = (void *)0x0;
  if ((in_RSI != (long *)0x0) && (lVar2 = (**(code **)(*in_RSI + 0x10))(), lVar2 != 0)) {
    local_68 = operator_new__(lVar2 + 1);
    (**(code **)*in_RSI)(in_RSI,local_68,lVar2);
    *(undefined1 *)((long)local_68 + lVar2) = 0;
  }
  if ((in_R8 != (long *)0x0) && (lVar2 = (**(code **)(*in_R8 + 0x10))(), lVar2 != 0)) {
    if (in_R8 == in_RSI) {
      (**(code **)(*in_R8 + 8))(in_R8,0,0);
    }
    local_70 = operator_new__(lVar2 + 1);
    (**(code **)*in_R8)(in_R8,local_70,lVar2);
    *(undefined1 *)((long)local_70 + lVar2) = 0;
  }
  if ((in_stack_00000010 != (long *)0x0) &&
     (lVar2 = (**(code **)(*in_stack_00000010 + 0x10))(), lVar2 != 0)) {
    if ((in_stack_00000010 == in_RSI) || (in_stack_00000010 == in_R8)) {
      (**(code **)(*in_stack_00000010 + 8))(in_stack_00000010,0,0);
    }
    local_78 = operator_new__(lVar2 + 1);
    (**(code **)*in_stack_00000010)(in_stack_00000010,local_78,lVar2);
    *(undefined1 *)((long)local_78 + lVar2) = 0;
  }
  sVar1 = (**(code **)(*in_RDI + 0x388))
                    (in_RDI,local_68,in_RDX,in_ECX,local_70,in_R9,in_stack_00000008,local_78,
                     in_stack_00000018,in_stack_00000020,in_stack_00000028,in_stack_00000030,
                     in_stack_00000038,in_stack_00000040,in_stack_00000048,in_stack_00000050);
  if (local_68 != (void *)0x0) {
    operator_delete__(local_68);
  }
  if (local_70 != (void *)0x0) {
    operator_delete__(local_70);
  }
  if (local_78 != (void *)0x0) {
    operator_delete__(local_78);
  }
  return sVar1;
}

Assistant:

s32 CNullDriver::addHighLevelShaderMaterialFromFiles(
		io::IReadFile *vertexShaderProgram,
		const c8 *vertexShaderEntryPointName,
		E_VERTEX_SHADER_TYPE vsCompileTarget,
		io::IReadFile *pixelShaderProgram,
		const c8 *pixelShaderEntryPointName,
		E_PIXEL_SHADER_TYPE psCompileTarget,
		io::IReadFile *geometryShaderProgram,
		const c8 *geometryShaderEntryPointName,
		E_GEOMETRY_SHADER_TYPE gsCompileTarget,
		scene::E_PRIMITIVE_TYPE inType, scene::E_PRIMITIVE_TYPE outType,
		u32 verticesOut,
		IShaderConstantSetCallBack *callback,
		E_MATERIAL_TYPE baseMaterial,
		s32 userData)
{
	c8 *vs = 0;
	c8 *ps = 0;
	c8 *gs = 0;

	if (vertexShaderProgram) {
		const long size = vertexShaderProgram->getSize();
		if (size) {
			vs = new c8[size + 1];
			vertexShaderProgram->read(vs, size);
			vs[size] = 0;
		}
	}

	if (pixelShaderProgram) {
		const long size = pixelShaderProgram->getSize();
		if (size) {
			// if both handles are the same we must reset the file
			if (pixelShaderProgram == vertexShaderProgram)
				pixelShaderProgram->seek(0);
			ps = new c8[size + 1];
			pixelShaderProgram->read(ps, size);
			ps[size] = 0;
		}
	}

	if (geometryShaderProgram) {
		const long size = geometryShaderProgram->getSize();
		if (size) {
			// if both handles are the same we must reset the file
			if ((geometryShaderProgram == vertexShaderProgram) ||
					(geometryShaderProgram == pixelShaderProgram))
				geometryShaderProgram->seek(0);
			gs = new c8[size + 1];
			geometryShaderProgram->read(gs, size);
			gs[size] = 0;
		}
	}

	s32 result = this->addHighLevelShaderMaterial(
			vs, vertexShaderEntryPointName, vsCompileTarget,
			ps, pixelShaderEntryPointName, psCompileTarget,
			gs, geometryShaderEntryPointName, gsCompileTarget,
			inType, outType, verticesOut,
			callback, baseMaterial, userData);

	delete[] vs;
	delete[] ps;
	delete[] gs;

	return result;
}